

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

Abc_Obj_t * Abc_AigMiter_rec(Abc_Aig_t *pMan,Abc_Obj_t **ppObjs,int nObjs)

{
  Abc_Obj_t *p0;
  Abc_Obj_t *p1;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj1;
  int nObjs_local;
  Abc_Obj_t **ppObjs_local;
  Abc_Aig_t *pMan_local;
  
  if (nObjs == 1) {
    pMan_local = (Abc_Aig_t *)*ppObjs;
  }
  else {
    p0 = Abc_AigMiter_rec(pMan,ppObjs,nObjs / 2);
    p1 = Abc_AigMiter_rec(pMan,ppObjs + nObjs / 2,nObjs - nObjs / 2);
    pMan_local = (Abc_Aig_t *)Abc_AigOr(pMan,p0,p1);
  }
  return (Abc_Obj_t *)pMan_local;
}

Assistant:

Abc_Obj_t * Abc_AigMiter_rec( Abc_Aig_t * pMan, Abc_Obj_t ** ppObjs, int nObjs )
{
    Abc_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Abc_AigMiter_rec( pMan, ppObjs,           nObjs/2 );
    pObj2 = Abc_AigMiter_rec( pMan, ppObjs + nObjs/2, nObjs - nObjs/2 );
    return Abc_AigOr( pMan, pObj1, pObj2 );
}